

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

Value * __thiscall
soul::Value::fromExternalValue(soul::Type_const&,choc::value::ValueView_const&,soul::
ConstantTable&,soul::StringDictionary&)::ConversionState::convert(soul::Type_const&,choc::value::
ValueView_const__(Value *__return_storage_ptr__,void *this,Type *targetType,ValueView *source)

{
  Content *pCVar1;
  MainType MVar2;
  Primitive PVar3;
  Object *pOVar4;
  MemberNameAndType *pMVar5;
  ConstantTable *this_00;
  ComplexArray *pCVar6;
  Allocator *pAVar7;
  int iVar8;
  uint32_t uVar9;
  Handle h;
  Structure *pSVar10;
  Value *extraout_RAX;
  Value *pVVar11;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 uVar12;
  Value *extraout_RAX_02;
  Handle h_00;
  Value *extraout_RAX_03;
  Value *extraout_RAX_04;
  Value *extraout_RAX_05;
  Value *extraout_RAX_06;
  Value *extraout_RAX_07;
  long *plVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  long lVar15;
  char *errorMessage;
  Member *targetType_00;
  ulong uVar16;
  size_t sVar17;
  string_view sVar18;
  Value result;
  MemberNameAndValue sourceMember;
  Type elementType;
  undefined1 local_2f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2e0;
  uchar *local_2d0;
  StringDictionary *local_2c8;
  size_t local_2b0;
  ValueView *local_2a8;
  undefined1 local_2a0 [8];
  ValueView local_298;
  ValueView local_260;
  undefined1 local_230 [56];
  Type local_1f8;
  uint32_t local_1dc;
  Structure *local_1d8;
  ulong local_1d0;
  Type local_1c8;
  ElementTypeAndOffset local_1b0;
  PrimitiveType local_184;
  Type local_180;
  Type local_168;
  CompileMessage local_150;
  CompileMessage local_118;
  CompileMessage local_e0;
  CompileMessage local_a8;
  Value local_70;
  
  MVar2 = (source->type).mainType;
  if (MVar2 < string) {
    if (MVar2 < int64) {
      if (MVar2 == boolean) {
        Value::Value((Value *)local_2f0,*source->data != '\0');
        castOrThrow(soul::Type_const&,soul::Value___
                  (__return_storage_ptr__,targetType,(Value *)local_2f0);
      }
      else {
        if (MVar2 != int32) goto LAB_001bd520;
        Value::Value((Value *)local_2f0,*(int32_t *)source->data);
        castOrThrow(soul::Type_const&,soul::Value___
                  (__return_storage_ptr__,targetType,(Value *)local_2f0);
      }
    }
    else if (MVar2 == int64) {
      Value::Value((Value *)local_2f0,*(int64_t *)source->data);
      castOrThrow(soul::Type_const&,soul::Value___
                (__return_storage_ptr__,targetType,(Value *)local_2f0);
    }
    else if (MVar2 == float32) {
      Value::Value((Value *)local_2f0,*(float *)source->data);
      castOrThrow(soul::Type_const&,soul::Value___
                (__return_storage_ptr__,targetType,(Value *)local_2f0);
    }
    else {
      if (MVar2 != float64) goto LAB_001bd520;
      Value::Value((Value *)local_2f0,*(double *)source->data);
      castOrThrow(soul::Type_const&,soul::Value___
                (__return_storage_ptr__,targetType,(Value *)local_2f0);
    }
LAB_001bd79d:
    ~Value((Value *)local_2f0);
    pVVar11 = extraout_RAX_07;
  }
  else {
    if (MVar2 < primitiveArray) {
      if (MVar2 == string) {
        plVar13 = *(long **)((long)this + 8);
        sVar18 = choc::value::ValueView::getString(source);
        pCVar1 = &local_298.type.content;
        local_2a0 = (undefined1  [8])pCVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a0,sVar18._M_str,sVar18._M_str + sVar18._M_len);
        h.handle = (**(code **)(*plVar13 + 0x10))
                             (plVar13,CONCAT71(local_298.type._1_7_,local_298.type.mainType),
                              local_2a0);
        createStringLiteral((Value *)local_2f0,h);
        castOrThrow(soul::Type_const&,soul::Value___
                  (__return_storage_ptr__,targetType,(Value *)local_2f0);
        ~Value((Value *)local_2f0);
        if (local_2a0 == (undefined1  [8])pCVar1) {
          return extraout_RAX_04;
        }
        operator_delete((void *)local_2a0,(ulong)(local_298.type.content._0_8_ + 1));
        return extraout_RAX_05;
      }
      if (MVar2 == vector) {
        uVar9 = choc::value::ValueView::size(source);
        if (targetType->category == primitive && uVar9 == 1) {
          choc::value::Type::getElementTypeAndOffset
                    ((ElementTypeAndOffset *)local_2a0,&source->type,0);
          local_2c8 = source->stringDictionary;
          local_2d0 = source->data + (long)local_298.type.allocator;
          local_2f0[0] = (Category)local_2a0[0];
          aStack_2e0._M_allocated_capacity = local_298.type.content._0_8_;
          aStack_2e0._8_8_ = local_298.type.content._8_8_;
          ValueView_const__(__return_storage_ptr__,this,targetType,(ValueView *)local_2f0);
          choc::value::ValueView::~ValueView((ValueView *)local_2f0);
          return extraout_RAX_02;
        }
        if (targetType->category != vector) {
          Type::getDescription_abi_cxx11_((string *)local_2f0,targetType);
          CompileMessageHelpers::createMessage<char_const(&)[7],std::__cxx11::string>
                    (&local_a8,(CompileMessageHelpers *)0x1,none,0x27e130,"vector",
                     (char (*) [7])local_2f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__);
          throwError(&local_a8);
        }
        PVar3 = (targetType->primitiveType).type;
        local_184.type = PVar3;
        Type::createVector(&local_168,&local_184,(ulong)uVar9);
        zeroInitialiser((Value *)local_2f0,&local_168);
        RefCountedPtr<soul::Structure>::decIfNotNull(local_168.structure.object);
        if (uVar9 != 0) {
          local_2a8 = (ValueView *)CONCAT71(local_2a8._1_7_,PVar3 != invalid);
          sVar17 = 0;
          do {
            SubElementPath::SubElementPath((SubElementPath *)local_230,sVar17);
            local_1f8.category = (Category)local_2a8;
            local_1f8.arrayElementCategory = invalid;
            local_1f8.isRef = false;
            local_1f8.isConstant = false;
            local_1f8.boundingSize = 0;
            local_1f8.arrayElementBoundingSize = 0;
            local_1f8.structure.object = (Structure *)0x0;
            local_1f8.primitiveType.type = PVar3;
            choc::value::Type::getElementTypeAndOffset(&local_1b0,&source->type,(uint32_t)sVar17);
            local_260.stringDictionary = source->stringDictionary;
            local_260.data = source->data + local_1b0.offset;
            local_260.type.mainType = local_1b0.elementType.mainType;
            local_260.type.content.object = local_1b0.elementType.content.object;
            local_260.type.content._8_8_ = local_1b0.elementType.content._8_8_;
            local_260.type.allocator = local_1b0.elementType.allocator;
            ValueView_const__((Value *)local_2a0,this,&local_1f8,&local_260);
            modifySubElementInPlace
                      ((Value *)local_2f0,(SubElementPath *)local_230,(Value *)local_2a0);
            ~Value((Value *)local_2a0);
            pAVar7 = local_260.type.allocator;
            uVar12 = local_260.type.content.object;
            if ((char)local_260.type.mainType < '\0') {
              if (local_260.type.mainType == object) {
                if (local_260.type.content.object != (Object *)0x0) {
                  choc::value::Type::Object::~Object(local_260.type.content.object);
                  goto LAB_001bd766;
                }
              }
              else if ((local_260.type.mainType == complexArray) &&
                      (local_260.type.content.object != (Object *)0x0)) {
                choc::value::Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::
                ~AllocatedVector((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                                 local_260.type.content.object);
LAB_001bd766:
                if (pAVar7 == (Allocator *)0x0) {
                  free((void *)uVar12);
                }
                else {
                  (**(code **)(*(long *)pAVar7 + 0x20))(pAVar7,uVar12);
                }
              }
            }
            RefCountedPtr<soul::Structure>::decIfNotNull(local_1f8.structure.object);
            local_230._8_8_ = 0;
            if (((Structure *)0x4 < (ulong)local_230._16_8_) &&
               ((unsigned_long *)local_230._0_8_ != (unsigned_long *)0x0)) {
              operator_delete__((void *)local_230._0_8_);
            }
            sVar17 = sVar17 + 1;
          } while (uVar9 != sVar17);
        }
        castOrThrow(soul::Type_const&,soul::Value___
                  (__return_storage_ptr__,targetType,(Value *)local_2f0);
        goto LAB_001bd79d;
      }
    }
    else {
      if ((MVar2 == primitiveArray) || (MVar2 == complexArray)) {
        uVar9 = choc::value::ValueView::size(source);
        if (targetType->boundingSize == 0 && targetType->category == array) {
          Type::getElementType((Type *)local_2a0,targetType);
          Type::createArray((Type *)local_230,(Type *)local_2a0,(ulong)uVar9);
          ValueView_const__((Value *)local_2f0,this,(Type *)local_230,source);
          RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_230._16_8_);
          this_00 = *this;
          Value::Value(&local_70,(Value *)local_2f0);
          h_00 = ConstantTable::getHandleForValue(this_00,&local_70);
          createUnsizedArray(__return_storage_ptr__,(Type *)local_2a0,h_00);
          ~Value(&local_70);
          ~Value((Value *)local_2f0);
          RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_298.type.content._0_8_);
          return extraout_RAX_03;
        }
        if ((targetType->category != array) ||
           (uVar16 = (ulong)uVar9, (long)targetType->boundingSize != uVar16)) {
          std::__cxx11::to_string((string *)local_230,uVar9);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2a0,"array[",(string *)local_230);
          plVar13 = (long *)std::__cxx11::string::append(local_2a0);
          local_2f0._0_8_ = *plVar13;
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._0_8_ == paVar14) {
            aStack_2e0._M_allocated_capacity = paVar14->_M_allocated_capacity;
            aStack_2e0._8_8_ = plVar13[3];
            local_2f0._0_8_ = &aStack_2e0;
          }
          else {
            aStack_2e0._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_2f0._8_8_ = plVar13[1];
          *plVar13 = (long)paVar14;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          Type::getDescription_abi_cxx11_((string *)&local_260,targetType);
          CompileMessageHelpers::createMessage<std::__cxx11::string,std::__cxx11::string>
                    (&local_e0,(CompileMessageHelpers *)0x1,none,0x27e130,local_2f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_260
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__);
          throwError(&local_e0);
        }
        Type::getArrayElementType(&local_1f8,targetType);
        Type::createArray(&local_180,&local_1f8,uVar16);
        zeroInitialiser((Value *)local_2f0,&local_180);
        RefCountedPtr<soul::Structure>::decIfNotNull(local_180.structure.object);
        if (uVar9 != 0) {
          sVar17 = 0;
          do {
            SubElementPath::SubElementPath((SubElementPath *)local_230,sVar17);
            choc::value::Type::getElementTypeAndOffset(&local_1b0,&source->type,(uint32_t)sVar17);
            local_260.stringDictionary = source->stringDictionary;
            local_260.data = source->data + local_1b0.offset;
            local_260.type.mainType = local_1b0.elementType.mainType;
            local_260.type.content.object = local_1b0.elementType.content.object;
            local_260.type.content._8_8_ = local_1b0.elementType.content._8_8_;
            local_260.type.allocator = local_1b0.elementType.allocator;
            ValueView_const__((Value *)local_2a0,this,&local_1f8,&local_260);
            modifySubElementInPlace
                      ((Value *)local_2f0,(SubElementPath *)local_230,(Value *)local_2a0);
            ~Value((Value *)local_2a0);
            pAVar7 = local_260.type.allocator;
            uVar12 = local_260.type.content.object;
            if ((char)local_260.type.mainType < '\0') {
              if (local_260.type.mainType == object) {
                if (local_260.type.content.object != (Object *)0x0) {
                  choc::value::Type::Object::~Object(local_260.type.content.object);
                  goto LAB_001bd4cf;
                }
              }
              else if ((local_260.type.mainType == complexArray) &&
                      (local_260.type.content.object != (Object *)0x0)) {
                choc::value::Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::
                ~AllocatedVector((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                                 local_260.type.content.object);
LAB_001bd4cf:
                if (pAVar7 == (Allocator *)0x0) {
                  free((void *)uVar12);
                }
                else {
                  (**(code **)(*(long *)pAVar7 + 0x20))(pAVar7,uVar12);
                }
              }
            }
            local_230._8_8_ = 0;
            if (((Structure *)0x4 < (ulong)local_230._16_8_) &&
               ((unsigned_long *)local_230._0_8_ != (unsigned_long *)0x0)) {
              operator_delete__((void *)local_230._0_8_);
            }
            sVar17 = sVar17 + 1;
          } while (uVar16 != sVar17);
        }
        castOrThrow(soul::Type_const&,soul::Value___
                  (__return_storage_ptr__,targetType,(Value *)local_2f0);
        ~Value((Value *)local_2f0);
        RefCountedPtr<soul::Structure>::decIfNotNull(local_1f8.structure.object);
        return extraout_RAX_06;
      }
      if (MVar2 == object) {
        local_2a8 = source;
        if (targetType->category == structure) {
          pSVar10 = Type::getStructRef(targetType);
          local_1dc = choc::value::ValueView::size(source);
          sVar17 = (pSVar10->members).numActive;
          if (sVar17 == local_1dc) {
            local_1c8.category = targetType->category;
            local_1c8.arrayElementCategory = targetType->arrayElementCategory;
            local_1c8.isRef = targetType->isRef;
            local_1c8.isConstant = targetType->isConstant;
            local_1c8.primitiveType.type = (targetType->primitiveType).type;
            local_1c8.boundingSize = targetType->boundingSize;
            local_1c8.arrayElementBoundingSize = targetType->arrayElementBoundingSize;
            local_1c8.structure.object = (targetType->structure).object;
            if (local_1c8.structure.object != (Structure *)0x0) {
              ((local_1c8.structure.object)->super_RefCountedObject).refCount =
                   ((local_1c8.structure.object)->super_RefCountedObject).refCount + 1;
            }
            zeroInitialiser(__return_storage_ptr__,&local_1c8);
            RefCountedPtr<soul::Structure>::decIfNotNull(local_1c8.structure.object);
            if ((pSVar10->members).numActive == 0) {
              return extraout_RAX;
            }
            pVVar11 = (Value *)0x0;
            local_2b0 = sVar17;
            local_1d8 = pSVar10;
            while (targetType_00 = (local_1d8->members).items + (long)pVVar11, local_1dc != 0) {
              lVar15 = 8;
              uVar16 = 0;
              local_1d0 = 0;
              do {
                if ((source->type).mainType != object) {
                  errorMessage = "This type is not an object";
LAB_001bd7c9:
                  choc::value::throwError(errorMessage);
                }
                pOVar4 = (source->type).content.object;
                if ((pOVar4->members).size <= uVar16) {
                  errorMessage = "Index out of range";
                  goto LAB_001bd7c9;
                }
                pMVar5 = (pOVar4->members).items;
                choc::value::Type::getElementTypeAndOffset
                          ((ElementTypeAndOffset *)local_2f0,&source->type,(uint32_t)uVar16);
                local_2a0 = *(undefined1 (*) [8])((long)&(pMVar5->name)._M_len + lVar15);
                local_298.stringDictionary = source->stringDictionary;
                local_298.data = source->data + (long)local_2d0;
                local_298.type.mainType = local_2f0[0];
                local_298.type.content._0_8_ = local_2f0._8_8_;
                local_298.type.content._8_8_ = aStack_2e0._M_allocated_capacity;
                local_298.type.allocator = (Allocator *)aStack_2e0._8_8_;
                iVar8 = std::__cxx11::string::compare((char *)&targetType_00->name);
                if (iVar8 == 0) {
                  SubElementPath::SubElementPath((SubElementPath *)local_230,(size_t)pVVar11);
                  ValueView_const__((Value *)local_2f0,this,&targetType_00->type,&local_298);
                  modifySubElementInPlace
                            (__return_storage_ptr__,(SubElementPath *)local_230,(Value *)local_2f0);
                  ~Value((Value *)local_2f0);
                  local_230._8_8_ = 0;
                  uVar12 = extraout_RAX_00;
                  if (((Structure *)0x4 < (ulong)local_230._16_8_) &&
                     ((unsigned_long *)local_230._0_8_ != (unsigned_long *)0x0)) {
                    operator_delete__((void *)local_230._0_8_);
                    uVar12 = extraout_RAX_01;
                  }
                  local_1d0 = CONCAT71((int7)((ulong)uVar12 >> 8),1);
                }
                pAVar7 = local_298.type.allocator;
                uVar12 = local_298.type.content._0_8_;
                if ((char)local_298.type.mainType < '\0') {
                  if (local_298.type.mainType == 0x90) {
                    if ((Structure *)local_298.type.content._0_8_ != (Structure *)0x0) {
                      choc::value::Type::Object::~Object((Object *)local_298.type.content._0_8_);
                      goto LAB_001bd022;
                    }
                  }
                  else if ((local_298.type.mainType == 0x80) &&
                          ((Structure *)local_298.type.content._0_8_ != (Structure *)0x0)) {
                    choc::value::Type::
                    AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::
                    ~AllocatedVector((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>
                                      *)local_298.type.content._0_8_);
LAB_001bd022:
                    if (pAVar7 == (Allocator *)0x0) {
                      free((void *)uVar12);
                      sVar17 = local_2b0;
                    }
                    else {
                      (**(code **)(*(long *)pAVar7 + 0x20))(pAVar7,uVar12);
                      sVar17 = local_2b0;
                    }
                  }
                }
                source = local_2a8;
                if (iVar8 == 0) break;
                uVar16 = uVar16 + 1;
                lVar15 = lVar15 + 0x30;
              } while (uVar16 < sVar17);
              if ((local_1d0 & 1) == 0) break;
              pVVar11 = (Value *)(ulong)((int)pVVar11 + 1);
              if ((Value *)(local_1d8->members).numActive <= pVVar11) {
                return pVVar11;
              }
            }
            CompileMessageHelpers::createMessage<std::__cxx11::string&,std::__cxx11::string_const&>
                      (&local_118,(CompileMessageHelpers *)0x1,none,0x27e151,
                       (char *)&targetType_00->name,&local_1d8->name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__);
            throwError(&local_118);
          }
          if ((source->type).mainType != object) {
            choc::value::throwError("This type is not an object");
          }
        }
        pCVar6 = (local_2a8->type).content.complexArray;
        lVar15 = *(long *)&(pCVar6->groups).size;
        local_2a0 = (undefined1  [8])&local_298.type.content;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a0,lVar15,(long)&((pCVar6->groups).items)->repetitions + lVar15)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2f0,"struct ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2a0);
        Type::getDescription_abi_cxx11_((string *)local_230,targetType);
        CompileMessageHelpers::createMessage<std::__cxx11::string,std::__cxx11::string>
                  (&local_150,(CompileMessageHelpers *)0x1,none,0x27e130,local_2f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__);
        throwError(&local_150);
      }
    }
LAB_001bd520:
    pVVar11 = (Value *)(__return_storage_ptr__->allocatedData).allocatedData.space;
    (__return_storage_ptr__->type).structure.object = (Structure *)0x0;
    (__return_storage_ptr__->allocatedData).allocatedSize = 0;
    (__return_storage_ptr__->type).category = invalid;
    (__return_storage_ptr__->type).arrayElementCategory = invalid;
    (__return_storage_ptr__->type).isRef = false;
    (__return_storage_ptr__->type).isConstant = false;
    (__return_storage_ptr__->type).primitiveType = invalid;
    (__return_storage_ptr__->type).boundingSize = 0;
    (__return_storage_ptr__->type).arrayElementBoundingSize = 0;
    (__return_storage_ptr__->allocatedData).allocatedData.items = (uchar *)pVVar11;
    (__return_storage_ptr__->allocatedData).allocatedData.numActive = 0;
    (__return_storage_ptr__->allocatedData).allocatedData.numAllocated = 8;
  }
  return pVVar11;
}

Assistant:

Value convert (const Type& targetType, const choc::value::ValueView& source)
        {
            if (source.isInt32())    return castOrThrow (targetType, Value::createInt32 (source.getInt32()));
            if (source.isInt64())    return castOrThrow (targetType, Value::createInt64 (source.getInt64()));
            if (source.isFloat32())  return castOrThrow (targetType, Value (source.getFloat32()));
            if (source.isFloat64())  return castOrThrow (targetType, Value (source.getFloat64()));
            if (source.isBool())     return castOrThrow (targetType, Value (source.getBool()));
            if (source.isString())   return castOrThrow (targetType, Value::createStringLiteral (dictionary.getHandleForString (std::string (source.getString()))));

            if (source.isVector())
            {
                auto size = source.size();

                if (size == 1 && targetType.isPrimitive())
                    return convert (targetType, source[0]);

                if (! targetType.isVector())
                    throwError (Errors::cannotCastBetween ("vector", targetType.getDescription()));

                auto elementType = targetType.getVectorElementType();
                auto result = Value::zeroInitialiser (Type::createVector (elementType, size));

                for (uint32_t i = 0; i < size; ++i)
                    result.modifySubElementInPlace (i, convert (elementType, source[i]));

                return castOrThrow (targetType, std::move (result));
            }

            if (source.isArray())
            {
                auto size = source.size();

                if (targetType.isUnsizedArray())
                {
                    auto elementType = targetType.getElementType();
                    auto fixedArray = convert (elementType.createArray (size), source);
                    return Value::createUnsizedArray (elementType, constants.getHandleForValue (std::move (fixedArray)));
                }

                if (! (targetType.isArray() && size == targetType.getArraySize()))
                    throwError (Errors::cannotCastBetween ("array[" + std::to_string (size) + "]", targetType.getDescription()));

                auto elementType = targetType.getArrayElementType();
                auto result = Value::zeroInitialiser (elementType.createArray (size));

                for (uint32_t i = 0; i < size; ++i)
                    result.modifySubElementInPlace (i, convert (elementType, source[i]));

                return castOrThrow (targetType, std::move (result));
            }

            if (source.isObject())
            {
                if (targetType.isStruct())
                {
                    auto& targetStruct = targetType.getStructRef();
                    auto numMembers = source.size();

                    if (targetStruct.getMembers().size() == numMembers)
                    {
                        auto result = Value::zeroInitialiser (targetType);

                        for (uint32_t j = 0; j < targetStruct.getMembers().size(); ++j)
                        {
                            auto& m = targetStruct.getMembers()[j];
                            bool found = false;

                            for (uint32_t i = 0; i < numMembers; ++i)
                            {
                                auto sourceMember = source.getObjectMemberAt (i);

                                if (m.name == sourceMember.name)
                                {
                                    result.modifySubElementInPlace (j, convert (m.type, sourceMember.value));
                                    found = true;
                                    break;
                                }
                            }

                            if (! found)
                                throwError (Errors::unknownMemberInStruct (m.name, targetStruct.getName()));
                        }

                        return result;
                    }
                }

                throwError (Errors::cannotCastBetween ("struct " + std::string (source.getObjectClassName()),
                                                       targetType.getDescription()));
            }

            return {};
        }